

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_insert(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  uint64_t uVar2;
  MSize key;
  int iVar3;
  uint key_00;
  GCtab *t;
  TValue *pTVar4;
  TValue TVar5;
  TValue *pTVar6;
  long lVar7;
  long lVar8;
  GCobj *o;
  
  t = lj_lib_checktab(L,1);
  key = lj_tab_len(t);
  iVar3 = *(int *)&L->top - *(int *)&L->base;
  key_00 = key + 1;
  if (iVar3 != 0x10) {
    if (iVar3 != 0x18) {
      lj_err_caller(L,LJ_ERR_TABINS);
    }
    key_00 = lj_lib_checkint(L,2);
    if ((int)key_00 <= (int)key) {
      lVar8 = (long)(int)(key + 1);
      lVar7 = lVar8 * 8;
      do {
        if (key + 1 < t->asize) {
          pTVar6 = (TValue *)((t->array).ptr64 + lVar7);
        }
        else {
          pTVar6 = lj_tab_setinth(L,t,key + 1);
        }
        if (key < t->asize) {
          pTVar4 = (TValue *)((t->array).ptr64 + lVar7 + -8);
        }
        else {
          pTVar4 = lj_tab_getinth(t,key);
        }
        if (pTVar4 == (TValue *)0x0) {
          TVar5.u64 = 0xffffffffffffffff;
        }
        else {
          TVar5 = *pTVar4;
        }
        lVar8 = lVar8 + -1;
        *pTVar6 = TVar5;
        key = key - 1;
        lVar7 = lVar7 + -8;
      } while ((int)key_00 < lVar8);
    }
  }
  if (key_00 < t->asize) {
    pTVar6 = (TValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
  }
  else {
    pTVar6 = lj_tab_setinth(L,t,key_00);
  }
  aVar1 = L->top[-1].field_4;
  pTVar6->field_4 = aVar1;
  if (((((int)aVar1.it >> 0xf) + 0xdU < 9) &&
      ((*(byte *)(((ulong)aVar1 & 0x7fffffffffff) + 8) & 3) != 0)) && ((t->marked & 4) != 0)) {
    uVar2 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
    *(GCtab **)(uVar2 + 0x40) = t;
  }
  return 0;
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}